

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::loadModel(FastText *this,string *filename)

{
  char cVar1;
  bool bVar2;
  invalid_argument *piVar3;
  ifstream ifs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  istream local_220 [520];
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_240,filename," cannot be opened for loading!");
    std::invalid_argument::invalid_argument(piVar3,(string *)&local_240);
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar2 = checkModel(this,local_220);
  if (bVar2) {
    loadModel(this,local_220);
    std::ifstream::close();
    std::ifstream::~ifstream(local_220);
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_240,filename," has wrong file format!");
  std::invalid_argument::invalid_argument(piVar3,(string *)&local_240);
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::loadModel(const std::string& filename) {
  std::ifstream ifs(filename, std::ifstream::binary);
  if (!ifs.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  if (!checkModel(ifs)) {
    throw std::invalid_argument(filename + " has wrong file format!");
  }
  loadModel(ifs);
  ifs.close();
}